

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allintra_vis.c
# Opt level: O2

void av1_set_mb_ur_variance(AV1_COMP *cpi)

{
  BLOCK_SIZE BVar1;
  byte bVar2;
  byte bVar3;
  undefined1 auVar4 [16];
  int iVar5;
  bool bVar6;
  uint8_t *puVar7;
  int iVar8;
  int iVar9;
  void *memblk;
  void *memblk_00;
  buf_2d *pbVar10;
  int iVar11;
  uint uVar12;
  ulong uVar13;
  int iVar15;
  long lVar16;
  ulong uVar17;
  int iVar18;
  uint uVar19;
  int mi_col;
  ulong uVar20;
  long lVar21;
  bool bVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  double local_158;
  uint local_14c;
  double local_148;
  undefined1 local_104 [36];
  ulong local_e0;
  ulong local_d8;
  ulong local_d0;
  undefined1 local_c8 [16];
  void *local_b8 [2];
  ulong local_a8;
  ulong local_a0;
  long local_98;
  ulong local_90;
  ulong local_88;
  ulong local_80;
  ulong local_78;
  uint8_t *local_70;
  ulong local_68;
  ulong local_60;
  void *local_58;
  buf_2d buf;
  void **ppvVar14;
  
  local_70 = (cpi->source->field_5).field_0.y_buffer;
  local_d0 = (ulong)(uint)(cpi->source->field_4).field_0.y_stride;
  BVar1 = ((cpi->common).seq_params)->sb_size;
  bVar2 = "\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"[BVar1];
  local_e0 = (ulong)bVar2;
  bVar3 = "\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"[BVar1];
  local_104._4_8_ = ZEXT18(bVar3);
  uVar19 = (int)((cpi->common).mi_params.mi_cols + (uint)bVar2 + -1) / (int)(uint)bVar2;
  uVar20 = (long)(int)((uint)bVar3 + (cpi->common).mi_params.mi_rows + -1) / (long)(int)(uint)bVar3;
  iVar15 = (int)uVar20;
  iVar8 = iVar15 * uVar19;
  memblk = aom_calloc((long)iVar8,4);
  local_b8[0] = memblk;
  if (memblk == (void *)0x0) {
    aom_internal_error((cpi->common).error,AOM_CODEC_MEM_ERROR,"Failed to allocate mb_delta_q[0]");
  }
  memblk_00 = aom_calloc((long)iVar8,4);
  local_58 = memblk_00;
  if (memblk_00 == (void *)0x0) {
    aom_internal_error((cpi->common).error,AOM_CODEC_MEM_ERROR,"Failed to allocate mb_delta_q[1]");
  }
  iVar5 = (int)local_d0;
  local_a0 = local_e0 & 0xffffffff;
  local_d8 = 0;
  if (0 < (int)uVar19) {
    local_d8 = (ulong)uVar19;
  }
  local_a8 = local_104._4_8_ & 0xffffffff;
  local_104._20_8_ = uVar20 & 0xffffffff;
  if (iVar15 < 1) {
    local_104._20_8_ = 0;
  }
  local_104._12_8_ = SEXT48((int)uVar19);
  iVar15 = (int)local_e0;
  local_c8 = (undefined1  [16])0x0;
  pbVar10 = &buf;
  local_14c = 0;
  uVar20 = 0;
  local_104._28_8_ = pbVar10;
  while (uVar20 != local_104._20_8_) {
    local_90 = (long)(int)local_14c;
    local_98 = uVar20 * local_104._12_8_;
    local_68 = (uVar20 + 1) * local_a8;
    iVar9 = 0;
    iVar11 = 0;
    local_88 = uVar20 + 1;
    uVar20 = 0;
    while (uVar20 != local_d8) {
      local_60 = (ulong)iVar11;
      local_80 = uVar20 + 1;
      uVar17 = local_80 * local_a0;
      local_158 = 0.0;
      local_148 = 0.0;
      local_78 = uVar20;
      for (uVar13 = local_90;
          (puVar7 = local_70, (long)uVar13 < (long)(cpi->common).mi_params.mi_rows &&
          (uVar13 < local_68)); uVar13 = uVar13 + 2) {
        iVar18 = iVar9;
        for (uVar20 = local_60;
            ((long)uVar20 < (long)(cpi->common).mi_params.mi_cols && (uVar20 < uVar17));
            uVar20 = uVar20 + 2) {
          buf.buf = puVar7 + (long)iVar18 + (long)(iVar5 * 4 * (int)uVar13);
          buf.stride = (int)local_d0;
          uVar19 = av1_get_perpixel_variance_facade(cpi,&(cpi->td).mb.e_mbd,&buf,BLOCK_8X8,0);
          dVar23 = log((double)(uVar19 + (uVar19 == 0)));
          local_148 = local_148 + dVar23;
          local_158 = local_158 + 1.0;
          iVar18 = iVar18 + 8;
        }
      }
      lVar21 = local_78 + local_98;
      dVar23 = exp(local_148 / local_158);
      dVar24 = exp(dVar23 * -0.004898);
      dVar25 = exp(dVar23 * -0.004898);
      uVar20 = -(ulong)(dVar24 * -98.0 + 131.728 < 0.0);
      *(int *)((long)memblk + lVar21 * 4) =
           (int)((double)(~uVar20 & 0x3fe0000000000000 | uVar20 & 0xbfe0000000000000) +
                dVar25 * -98.0 + 131.728);
      dVar24 = exp(dVar23 * -0.003093);
      uVar20 = -(ulong)(dVar24 * -68.8 + 180.4 < 0.0);
      dVar23 = exp(dVar23 * -0.003093);
      iVar18 = (int)(dVar23 * -68.8 + 180.4 +
                    (double)(~uVar20 & 0x3fe0000000000000 | uVar20 & 0xbfe0000000000000));
      *(int *)((long)memblk_00 + lVar21 * 4) = iVar18;
      local_c8._0_4_ = local_c8._0_4_ + iVar18;
      local_c8._4_4_ = local_c8._4_4_ + *(int *)((long)memblk + lVar21 * 4);
      iVar11 = iVar11 + (int)local_e0;
      iVar9 = iVar9 + iVar15 * 4;
      uVar20 = local_80;
    }
    local_14c = local_14c + local_104._4_4_;
    pbVar10 = (buf_2d *)(ulong)local_14c;
    uVar20 = local_88;
  }
  auVar26._0_8_ = (double)local_c8._0_4_;
  auVar26._8_8_ = (double)local_c8._4_4_;
  auVar27._0_8_ = (double)iVar8;
  auVar27._8_8_ = auVar27._0_8_;
  auVar26 = divpd(auVar26,auVar27);
  auVar4._8_8_ = -(ulong)(auVar26._8_8_ < 0.0);
  auVar4._0_8_ = -(ulong)(auVar26._0_8_ < 0.0);
  uVar19 = movmskpd((int)pbVar10,auVar4);
  dVar23 = -0.5;
  dVar24 = -0.5;
  if ((uVar19 & 2) == 0) {
    dVar24 = 0.5;
  }
  iVar8 = (int)(auVar26._8_8_ + dVar24);
  buf.buf = (uint8_t *)CONCAT44(buf.buf._4_4_,iVar8);
  if ((uVar19 & 1) == 0) {
    dVar23 = 0.5;
  }
  local_104._0_4_ = (undefined4)(auVar26._0_8_ + dVar23);
  uVar19 = (cpi->oxcf).rc_cfg.cq_level;
  uVar12 = uVar19 - iVar8;
  ppvVar14 = (void **)(ulong)uVar12;
  if ((int)uVar19 < iVar8) {
    ppvVar14 = local_b8;
    bVar6 = false;
    uVar12 = uVar19;
    iVar15 = iVar8;
  }
  else if ((int)uVar19 < (int)local_104._0_4_) {
    iVar15 = local_104._0_4_ - iVar8;
    bVar6 = true;
  }
  else {
    uVar12 = 0xff - uVar19;
    iVar15 = 0xff - local_104._0_4_;
    ppvVar14 = &local_58;
    local_104._28_8_ = local_104;
    bVar6 = false;
  }
  dVar23 = (double)(int)uVar12 / (double)iVar15;
  lVar21 = 0;
  for (uVar20 = 0; lVar16 = lVar21, uVar13 = local_d8, uVar20 != local_104._20_8_;
      uVar20 = uVar20 + 1) {
    while (bVar22 = uVar13 != 0, uVar13 = uVar13 - 1, bVar22) {
      if (bVar6) {
        dVar25 = ((double)(*(int *)((long)memblk_00 + lVar16) - *(int *)((long)memblk + lVar16)) *
                  dVar23 + (double)*(int *)((long)memblk + lVar16)) -
                 ((double)(local_104._0_4_ - iVar8) * dVar23 + (double)iVar8);
        dVar24 = (double)(cpi->oxcf).q_cfg.deltaq_strength / 100.0;
      }
      else {
        dVar25 = ((double)(cpi->oxcf).q_cfg.deltaq_strength / 100.0) * dVar23;
        dVar24 = (double)(*(int *)((long)*ppvVar14 + lVar16) - *(int *)(uint8_t **)local_104._28_8_)
        ;
      }
      *(int *)((long)cpi->mb_delta_q + lVar16) =
           (int)(dVar24 * dVar25 + *(double *)(&DAT_00be0dc0 + (ulong)(dVar24 * dVar25 < 0.0) * 8));
      lVar16 = lVar16 + 4;
    }
    lVar21 = lVar21 + local_104._12_8_ * 4;
  }
  aom_free(memblk);
  aom_free(memblk_00);
  return;
}

Assistant:

void av1_set_mb_ur_variance(AV1_COMP *cpi) {
  const AV1_COMMON *cm = &cpi->common;
  const CommonModeInfoParams *const mi_params = &cm->mi_params;
  const MACROBLOCKD *const xd = &cpi->td.mb.e_mbd;
  uint8_t *y_buffer = cpi->source->y_buffer;
  const int y_stride = cpi->source->y_stride;
  const int block_size = cpi->common.seq_params->sb_size;

  const int num_mi_w = mi_size_wide[block_size];
  const int num_mi_h = mi_size_high[block_size];
  const int num_cols = (mi_params->mi_cols + num_mi_w - 1) / num_mi_w;
  const int num_rows = (mi_params->mi_rows + num_mi_h - 1) / num_mi_h;

  int *mb_delta_q[2];
  CHECK_MEM_ERROR(cm, mb_delta_q[0],
                  aom_calloc(num_rows * num_cols, sizeof(*mb_delta_q[0])));
  CHECK_MEM_ERROR(cm, mb_delta_q[1],
                  aom_calloc(num_rows * num_cols, sizeof(*mb_delta_q[1])));

  // Approximates the model change between current version (Spet 2021) and the
  // baseline (July 2021).
  const double model_change[] = { 3.0, 3.0 };
  // The following parameters are fitted from user labeled data.
  const double a[] = { -24.50 * 4.0, -17.20 * 4.0 };
  const double b[] = { 0.004898, 0.003093 };
  const double c[] = { (29.932 + model_change[0]) * 4.0,
                       (42.100 + model_change[1]) * 4.0 };
  int delta_q_avg[2] = { 0, 0 };
  // Loop through each SB block.
  for (int row = 0; row < num_rows; ++row) {
    for (int col = 0; col < num_cols; ++col) {
      double var = 0.0, num_of_var = 0.0;
      const int index = row * num_cols + col;

      // Loop through each 8x8 block.
      for (int mi_row = row * num_mi_h;
           mi_row < mi_params->mi_rows && mi_row < (row + 1) * num_mi_h;
           mi_row += 2) {
        for (int mi_col = col * num_mi_w;
             mi_col < mi_params->mi_cols && mi_col < (col + 1) * num_mi_w;
             mi_col += 2) {
          struct buf_2d buf;
          const int row_offset_y = mi_row << 2;
          const int col_offset_y = mi_col << 2;

          buf.buf = y_buffer + row_offset_y * y_stride + col_offset_y;
          buf.stride = y_stride;

          unsigned int block_variance;
          block_variance = av1_get_perpixel_variance_facade(
              cpi, xd, &buf, BLOCK_8X8, AOM_PLANE_Y);

          block_variance = AOMMAX(block_variance, 1);
          var += log((double)block_variance);
          num_of_var += 1.0;
        }
      }
      var = exp(var / num_of_var);
      mb_delta_q[0][index] = RINT(a[0] * exp(-b[0] * var) + c[0]);
      mb_delta_q[1][index] = RINT(a[1] * exp(-b[1] * var) + c[1]);
      delta_q_avg[0] += mb_delta_q[0][index];
      delta_q_avg[1] += mb_delta_q[1][index];
    }
  }

  delta_q_avg[0] = RINT((double)delta_q_avg[0] / (num_rows * num_cols));
  delta_q_avg[1] = RINT((double)delta_q_avg[1] / (num_rows * num_cols));

  int model_idx;
  double scaling_factor;
  const int cq_level = cpi->oxcf.rc_cfg.cq_level;
  if (cq_level < delta_q_avg[0]) {
    model_idx = 0;
    scaling_factor = (double)cq_level / delta_q_avg[0];
  } else if (cq_level < delta_q_avg[1]) {
    model_idx = 2;
    scaling_factor =
        (double)(cq_level - delta_q_avg[0]) / (delta_q_avg[1] - delta_q_avg[0]);
  } else {
    model_idx = 1;
    scaling_factor = (double)(MAXQ - cq_level) / (MAXQ - delta_q_avg[1]);
  }

  const double new_delta_q_avg =
      delta_q_avg[0] + scaling_factor * (delta_q_avg[1] - delta_q_avg[0]);
  for (int row = 0; row < num_rows; ++row) {
    for (int col = 0; col < num_cols; ++col) {
      const int index = row * num_cols + col;
      if (model_idx == 2) {
        const double delta_q =
            mb_delta_q[0][index] +
            scaling_factor * (mb_delta_q[1][index] - mb_delta_q[0][index]);
        cpi->mb_delta_q[index] = RINT((double)cpi->oxcf.q_cfg.deltaq_strength /
                                      100.0 * (delta_q - new_delta_q_avg));
      } else {
        cpi->mb_delta_q[index] = RINT(
            (double)cpi->oxcf.q_cfg.deltaq_strength / 100.0 * scaling_factor *
            (mb_delta_q[model_idx][index] - delta_q_avg[model_idx]));
      }
    }
  }

  aom_free(mb_delta_q[0]);
  aom_free(mb_delta_q[1]);
}